

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.h
# Opt level: O3

Graph<Node> * __thiscall Graph<Node>::operator=(Graph<Node> *this,Graph<Node> *other)

{
  int iVar1;
  
  iVar1 = other->_edgeCnt;
  this->_nodeCnt = other->_nodeCnt;
  this->_edgeCnt = iVar1;
  vector<NodeList<Node>_>::operator=(&this->G,&other->G);
  vector<Edge>::operator=(&this->edges,&other->edges);
  vector<vector<int>_>::operator=(&this->minDist,&other->minDist);
  vector<vector<int>_>::operator=(&this->nextNodeInPath,&other->nextNodeInPath);
  vector<vector<int>_>::operator=(&this->compList,&other->compList);
  vector<int>::operator=(&this->inCC,&other->inCC);
  return this;
}

Assistant:

Graph &operator = (const Graph &other) {
        _nodeCnt = other._nodeCnt;
        _edgeCnt = other._edgeCnt;
        G = other.G;
        edges = other.edges;
        minDist = other.minDist;
        nextNodeInPath = other.nextNodeInPath;
        compList = other.compList;
        inCC = other.inCC;
        return *this;
    }